

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O0

void transpose_16bit_8x4(__m128i *in,__m128i *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  __m128i a0;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  __m128i zeros;
  __m128i b6;
  __m128i b4;
  __m128i b2;
  __m128i b0;
  __m128i a5;
  __m128i a4;
  __m128i a1;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  local_1e8 = (undefined2)uVar1;
  uStack_1e6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1e4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1e2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1f8 = (undefined2)uVar2;
  uStack_1f6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1f4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1f2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[4];
  uVar2 = in_RDI[6];
  local_208 = (undefined2)uVar1;
  uStack_206 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_204 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_202 = (undefined2)((ulong)uVar1 >> 0x30);
  local_218 = (undefined2)uVar2;
  uStack_216 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_214 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_212 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[1];
  uVar2 = in_RDI[3];
  uStack_1a0 = (undefined2)uVar1;
  uStack_19e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_19c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_19a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1b0 = (undefined2)uVar2;
  uStack_1ae = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1ac = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1aa = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[5];
  uVar2 = in_RDI[7];
  uStack_1c0 = (undefined2)uVar1;
  uStack_1be = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1bc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1ba = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1d0 = (undefined2)uVar2;
  uStack_1ce = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1cc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1ca = (undefined2)((ulong)uVar2 >> 0x30);
  *in_RSI = local_1e8;
  in_RSI[1] = local_1f8;
  in_RSI[2] = local_208;
  in_RSI[3] = local_218;
  in_RSI[4] = 0;
  in_RSI[5] = 0;
  in_RSI[6] = 0;
  in_RSI[7] = 0;
  in_RSI[8] = uStack_1e6;
  in_RSI[9] = uStack_1f6;
  in_RSI[10] = uStack_206;
  in_RSI[0xb] = uStack_216;
  in_RSI[0xc] = 0;
  in_RSI[0xd] = 0;
  in_RSI[0xe] = 0;
  in_RSI[0xf] = 0;
  in_RSI[0x10] = uStack_1e4;
  in_RSI[0x11] = uStack_1f4;
  in_RSI[0x12] = uStack_204;
  in_RSI[0x13] = uStack_214;
  in_RSI[0x14] = 0;
  in_RSI[0x15] = 0;
  in_RSI[0x16] = 0;
  in_RSI[0x17] = 0;
  in_RSI[0x18] = uStack_1e2;
  in_RSI[0x19] = uStack_1f2;
  in_RSI[0x1a] = uStack_202;
  in_RSI[0x1b] = uStack_212;
  in_RSI[0x1c] = 0;
  in_RSI[0x1d] = 0;
  in_RSI[0x1e] = 0;
  in_RSI[0x1f] = 0;
  in_RSI[0x20] = uStack_1a0;
  in_RSI[0x21] = uStack_1b0;
  in_RSI[0x22] = uStack_1c0;
  in_RSI[0x23] = uStack_1d0;
  in_RSI[0x24] = 0;
  in_RSI[0x25] = 0;
  in_RSI[0x26] = 0;
  in_RSI[0x27] = 0;
  in_RSI[0x28] = uStack_19e;
  in_RSI[0x29] = uStack_1ae;
  in_RSI[0x2a] = uStack_1be;
  in_RSI[0x2b] = uStack_1ce;
  in_RSI[0x2c] = 0;
  in_RSI[0x2d] = 0;
  in_RSI[0x2e] = 0;
  in_RSI[0x2f] = 0;
  in_RSI[0x30] = uStack_19c;
  in_RSI[0x31] = uStack_1ac;
  in_RSI[0x32] = uStack_1bc;
  in_RSI[0x33] = uStack_1cc;
  in_RSI[0x34] = 0;
  in_RSI[0x35] = 0;
  in_RSI[0x36] = 0;
  in_RSI[0x37] = 0;
  in_RSI[0x38] = uStack_19a;
  in_RSI[0x39] = uStack_1aa;
  in_RSI[0x3a] = uStack_1ba;
  in_RSI[0x3b] = uStack_1ca;
  in_RSI[0x3c] = 0;
  in_RSI[0x3d] = 0;
  in_RSI[0x3e] = 0;
  in_RSI[0x3f] = 0;
  return;
}

Assistant:

static inline void transpose_16bit_8x4(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  04 05 06 07
  // in[1]: 10 11 12 13  14 15 16 17
  // in[2]: 20 21 22 23  24 25 26 27
  // in[3]: 30 31 32 33  34 35 36 37

  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  // a4:    04 14 05 15  06 16 07 17
  // a5:    24 34 25 35  26 36 27 37
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);
  const __m128i a4 = _mm_unpackhi_epi16(in[0], in[1]);
  const __m128i a5 = _mm_unpackhi_epi16(in[2], in[3]);

  // Unpack 32 bit elements resulting in:
  // b0: 00 10 20 30  01 11 21 31
  // b2: 04 14 24 34  05 15 25 35
  // b4: 02 12 22 32  03 13 23 33
  // b6: 06 16 26 36  07 17 27 37
  const __m128i b0 = _mm_unpacklo_epi32(a0, a1);
  const __m128i b2 = _mm_unpacklo_epi32(a4, a5);
  const __m128i b4 = _mm_unpackhi_epi32(a0, a1);
  const __m128i b6 = _mm_unpackhi_epi32(a4, a5);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30  XX XX XX XX
  // out[1]: 01 11 21 31  XX XX XX XX
  // out[2]: 02 12 22 32  XX XX XX XX
  // out[3]: 03 13 23 33  XX XX XX XX
  // out[4]: 04 14 24 34  XX XX XX XX
  // out[5]: 05 15 25 35  XX XX XX XX
  // out[6]: 06 16 26 36  XX XX XX XX
  // out[7]: 07 17 27 37  XX XX XX XX
  const __m128i zeros = _mm_setzero_si128();
  out[0] = _mm_unpacklo_epi64(b0, zeros);
  out[1] = _mm_unpackhi_epi64(b0, zeros);
  out[2] = _mm_unpacklo_epi64(b4, zeros);
  out[3] = _mm_unpackhi_epi64(b4, zeros);
  out[4] = _mm_unpacklo_epi64(b2, zeros);
  out[5] = _mm_unpackhi_epi64(b2, zeros);
  out[6] = _mm_unpacklo_epi64(b6, zeros);
  out[7] = _mm_unpackhi_epi64(b6, zeros);
}